

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

string * __thiscall
File::utf8TextInRange_abi_cxx11_(string *__return_storage_ptr__,File *this,Range *range)

{
  u16string uStack_38;
  
  TextBuffer::text_in_range_abi_cxx11_(&uStack_38,&this->buffer,*range);
  UtfHandler::utf16to8(__return_storage_ptr__,&this->utf,&uStack_38);
  std::__cxx11::u16string::~u16string((u16string *)&uStack_38);
  return __return_storage_ptr__;
}

Assistant:

string File::utf8TextInRange (const Range &range) {
    return utf.utf16to8(buffer.text_in_range(range));
}